

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::SingleVertexArrayOutputTypeGroup::init
          (SingleVertexArrayOutputTypeGroup *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  OutputType outputType_;
  int t;
  InputType type;
  GLValue min_;
  GLValue max_;
  byte bVar2;
  uint uVar3;
  ulong in_RAX;
  MultiVertexArrayTest *this_00;
  byte bVar4;
  OutputType type_00;
  int t_00;
  ulong uVar5;
  long lVar6;
  GLValue GVar7;
  GLValue GVar8;
  Spec spec;
  undefined4 uStack_14c;
  undefined4 uStack_13c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string name;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  ArraySpec arraySpec;
  string local_50;
  
  uVar5 = 0;
  do {
    if (uVar5 == 9) {
      return (int)in_RAX;
    }
    uVar3 = (int)uVar5 - 6;
    uVar1 = uVar5 - 3;
    in_RAX = uVar1;
    for (t_00 = 2; t_00 != 5; t_00 = t_00 + 1) {
      for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 4) {
        typeToString<int>(&local_d0,t_00);
        std::operator+(&local_b0,"components",&local_d0);
        std::operator+(&local_130,&local_b0,"_");
        outputType_ = (&DAT_0184af60)[uVar5];
        deqp::gls::Array::outputTypeToString_abi_cxx11_
                  (&local_f0,(Array *)(ulong)outputType_,type_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&spec,
                       &local_130,&local_f0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &arraySpec,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&spec,
                       "_quads");
        t = *(int *)((long)&DAT_0181a4e0 + lVar6);
        typeToString<int>(&local_50,t);
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &arraySpec,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&arraySpec);
        std::__cxx11::string::~string((string *)&spec);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        type = this->m_type;
        bVar2 = 0x67U >> ((byte)type & 0x1f) | INPUTTYPE_INT < type;
        bVar4 = (byte)(0x9f >> ((byte)type & 0x1f)) | INPUTTYPE_UNSIGNED_INT < type;
        if ((type < INPUTTYPE_UNSIGNED_INT_2_10_10_10) && ((0x203U >> (type & 0x1f) & 1) != 0)) {
          if (5 < uVar1) {
LAB_0104766f:
            if ((byte)((uVar5 < 6 | bVar2) & (type != INPUTTYPE_INT_2_10_10_10 || t_00 == 4) &
                      (uVar3 < 0xfffffffd | bVar4)) != 0) {
LAB_010476a2:
              GVar7 = deqp::gls::GLValue::getMinValue(type);
              GVar8 = deqp::gls::GLValue::getMaxValue(this->m_type);
              max_._4_4_ = uStack_14c;
              max_.type = GVar8.type;
              min_._4_4_ = uStack_13c;
              min_.type = GVar7.type;
              min_.field_1 = GVar7.field_1;
              max_.field_1 = GVar8.field_1;
              deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                        (&arraySpec,type,outputType_,STORAGE_USER,USAGE_DYNAMIC_DRAW,t_00,0,0,false,
                         min_,max_);
              spec.arrays.
              super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              spec.arrays.
              super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              spec.arrays.
              super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              spec.primitive = PRIMITIVE_TRIANGLES;
              spec.first = 0;
              spec.drawCount = t;
              std::
              vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
              ::push_back(&spec.arrays,&arraySpec);
              this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
              deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                        (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                                 m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,
                         &spec,name._M_dataplus._M_p,name._M_dataplus._M_p);
              tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
              std::
              _Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
              ::~_Vector_base(&spec.arrays.
                               super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                             );
            }
          }
        }
        else if ((type & ~INPUTTYPE_FIXED) != INPUTTYPE_UNSIGNED_INT_2_10_10_10 || 5 < uVar1) {
          if (type != INPUTTYPE_UNSIGNED_INT_2_10_10_10) goto LAB_0104766f;
          if ((~((uVar3 < 0xfffffffd | bVar4) & (uVar5 < 6 | bVar2)) & 1) == 0 && t_00 == 4)
          goto LAB_010476a2;
        }
        in_RAX = std::__cxx11::string::~string((string *)&name);
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void SingleVertexArrayOutputTypeGroup::init (void)
{
	Array::OutputType	outputTypes[]	= {Array::OUTPUTTYPE_VEC2, Array::OUTPUTTYPE_VEC3, Array::OUTPUTTYPE_VEC4, Array::OUTPUTTYPE_IVEC2, Array::OUTPUTTYPE_IVEC3, Array::OUTPUTTYPE_IVEC4, Array::OUTPUTTYPE_UVEC2, Array::OUTPUTTYPE_UVEC3, Array::OUTPUTTYPE_UVEC4 };
	Array::Storage		storages[]		= {Array::STORAGE_USER};
	int					counts[]		= {1, 256};

	for (int outputTypeNdx = 0; outputTypeNdx < DE_LENGTH_OF_ARRAY(outputTypes); outputTypeNdx++)
	{
		for (int storageNdx = 0; storageNdx < DE_LENGTH_OF_ARRAY(storages); storageNdx++)
		{
			for (int componentCount = 2; componentCount < 5; componentCount++)
			{
				for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
				{
					std::string name = "components" + typeToString(componentCount) + "_" + Array::outputTypeToString(outputTypes[outputTypeNdx]) + "_quads" + typeToString(counts[countNdx]);

					const bool inputIsSignedInteger		= m_type == Array::INPUTTYPE_INT || m_type == Array::INPUTTYPE_SHORT || m_type == Array::INPUTTYPE_BYTE;
					const bool inputIsUnignedInteger	= m_type == Array::INPUTTYPE_UNSIGNED_INT || m_type == Array::INPUTTYPE_UNSIGNED_SHORT || m_type == Array::INPUTTYPE_UNSIGNED_BYTE;
					const bool outputIsSignedInteger	= outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_IVEC2 || outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_IVEC3 || outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_IVEC4;
					const bool outputIsUnsignedInteger	= outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_UVEC2 || outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_UVEC3 || outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_UVEC4;

					// If input type is float type and output type is int type skip
					if ((m_type == Array::INPUTTYPE_FLOAT ||  m_type == Array::INPUTTYPE_HALF || m_type == Array::INPUTTYPE_FIXED) && (outputTypes[outputTypeNdx] >= Array::OUTPUTTYPE_INT))
						continue;

					if((m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10) && (outputTypes[outputTypeNdx] >= Array::OUTPUTTYPE_INT))
						continue;

					if((m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10) && componentCount != 4)
						continue;

					// Loading signed data as unsigned causes undefined values and vice versa
					if (inputIsSignedInteger && outputIsUnsignedInteger)
						continue;
					if (inputIsUnignedInteger && outputIsSignedInteger)
						continue;

					MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
																	outputTypes[outputTypeNdx],
																	storages[storageNdx],
																	Array::USAGE_DYNAMIC_DRAW,
																	componentCount,
																	0,
																	0,
																	false,
																	GLValue::getMinValue(m_type),
																	GLValue::getMaxValue(m_type));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}